

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LoopLayerParams::SharedDtor(LoopLayerParams *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->conditionvar_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if (this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    if (this->conditionnetwork_ != (NeuralNetwork *)0x0) {
      (*(this->conditionnetwork_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->bodynetwork_ != (NeuralNetwork *)0x0) {
      (*(this->bodynetwork_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void LoopLayerParams::SharedDtor() {
  conditionvar_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete conditionnetwork_;
  }
  if (this != internal_default_instance()) {
    delete bodynetwork_;
  }
}